

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathNodeSetAddUnique(xmlNodeSetPtr cur,xmlNodePtr val)

{
  int iVar1;
  xmlNodePtr pxVar2;
  xmlNodePtr nsNode;
  xmlNsPtr ns;
  xmlNodePtr val_local;
  xmlNodeSetPtr cur_local;
  
  if ((cur == (xmlNodeSetPtr)0x0) || (val == (xmlNodePtr)0x0)) {
    cur_local._4_4_ = -1;
  }
  else if ((cur->nodeNr < cur->nodeMax) || (iVar1 = xmlXPathNodeSetGrow(cur), -1 < iVar1)) {
    if (val->type == XML_NAMESPACE_DECL) {
      pxVar2 = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val);
      if (pxVar2 == (xmlNodePtr)0x0) {
        return -1;
      }
      iVar1 = cur->nodeNr;
      cur->nodeNr = iVar1 + 1;
      cur->nodeTab[iVar1] = pxVar2;
    }
    else {
      iVar1 = cur->nodeNr;
      cur->nodeNr = iVar1 + 1;
      cur->nodeTab[iVar1] = val;
    }
    cur_local._4_4_ = 0;
  }
  else {
    cur_local._4_4_ = -1;
  }
  return cur_local._4_4_;
}

Assistant:

int
xmlXPathNodeSetAddUnique(xmlNodeSetPtr cur, xmlNodePtr val) {
    if ((cur == NULL) || (val == NULL)) return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeNr >= cur->nodeMax) {
        if (xmlXPathNodeSetGrow(cur) < 0)
            return(-1);
    }

    if (val->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) val;
        xmlNodePtr nsNode = xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);

        if (nsNode == NULL)
            return(-1);
	cur->nodeTab[cur->nodeNr++] = nsNode;
    } else
	cur->nodeTab[cur->nodeNr++] = val;
    return(0);
}